

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

errr finish_parse_names(parser *p)

{
  undefined8 uVar1;
  void *p_00;
  char **ppcVar2;
  bool bVar3;
  undefined8 *local_28;
  name *nm;
  names_parse *n;
  uint j;
  wchar_t i;
  parser *p_local;
  
  p_00 = parser_priv(p);
  name_sections = (char ***)mem_zalloc(0x18);
  for (n._4_4_ = 0; n._4_4_ < 3; n._4_4_ = n._4_4_ + 1) {
    ppcVar2 = (char **)mem_alloc((ulong)(*(int *)((long)p_00 + (long)n._4_4_ * 4 + 4) + 1) << 3);
    name_sections[n._4_4_] = ppcVar2;
    local_28 = *(undefined8 **)((long)p_00 + (long)n._4_4_ * 8 + 0x10);
    n._0_4_ = 0;
    while( true ) {
      bVar3 = false;
      if (local_28 != (undefined8 *)0x0) {
        bVar3 = (uint)n < *(uint *)((long)p_00 + (long)n._4_4_ * 4 + 4);
      }
      if (!bVar3) break;
      name_sections[n._4_4_][(uint)n] = (char *)local_28[1];
      local_28 = (undefined8 *)*local_28;
      n._0_4_ = (uint)n + 1;
    }
    name_sections[n._4_4_][*(uint *)((long)p_00 + (long)n._4_4_ * 4 + 4)] = (char *)0x0;
    while (*(long *)((long)p_00 + (long)n._4_4_ * 8 + 0x10) != 0) {
      uVar1 = **(undefined8 **)((long)p_00 + (long)n._4_4_ * 8 + 0x10);
      mem_free(*(void **)((long)p_00 + (long)n._4_4_ * 8 + 0x10));
      *(undefined8 *)((long)p_00 + (long)n._4_4_ * 8 + 0x10) = uVar1;
    }
  }
  mem_free(p_00);
  parser_destroy(p);
  return 0;
}

Assistant:

static errr finish_parse_names(struct parser *p) {
	int i;
	unsigned int j;
	struct names_parse *n = parser_priv(p);
	struct name *nm;
	name_sections = mem_zalloc(sizeof(char**) * RANDNAME_NUM_TYPES);
	for (i = 0; i < RANDNAME_NUM_TYPES; i++) {
		name_sections[i] = mem_alloc(sizeof(char*) * (n->nnames[i] + 1));
		for (nm = n->names[i], j = 0; nm && j < n->nnames[i]; nm = nm->next, j++) {
			name_sections[i][j] = nm->str;
		}
		name_sections[i][n->nnames[i]] = NULL;
		while (n->names[i]) {
			nm = n->names[i]->next;
			mem_free(n->names[i]);
			n->names[i] = nm;
		}
	}
	mem_free(n);
	parser_destroy(p);
	return 0;
}